

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O1

void sylvan_serialize_fromfile(FILE *in)

{
  ulong uVar1;
  size_t sVar2;
  BDD low;
  BDD high;
  ulong uVar3;
  size_t count;
  sylvan_ser s;
  mtbddnode node;
  int local_6c;
  ulong local_68;
  FILE *local_60;
  ulong local_58;
  sylvan_ser local_50;
  ulong local_40;
  ulong local_38;
  
  local_60 = (FILE *)in;
  sVar2 = fread(&local_58,8,1,(FILE *)in);
  if (sVar2 == 1) {
    local_68 = local_58;
    if (local_58 != 0) {
      uVar3 = 1;
      do {
        sVar2 = fread(&local_40,0x10,1,local_60);
        uVar1 = local_38;
        if (sVar2 != 1) goto LAB_0011df96;
        low = sylvan_serialize_get_reversed(local_38 & 0xffffffffff);
        high = sylvan_serialize_get_reversed(local_40 & 0x800000ffffffffff);
        if (low != high) {
          low = _mtbdd_makenode((uint)(uVar1 >> 0x28),low,high);
        }
        sylvan_ser_done = sylvan_ser_done + 1;
        local_6c = 0;
        local_50.bdd = low;
        local_50.assigned = sylvan_ser_done;
        sylvan_ser_put(&sylvan_ser_set,&local_50,&local_6c);
        local_6c = 0;
        sylvan_ser_reversed_put(&sylvan_ser_reversed_set,&local_50,&local_6c);
        uVar3 = uVar3 + 1;
      } while (uVar3 <= local_68);
    }
    return;
  }
LAB_0011df96:
  puts("sylvan_serialize_fromfile: file format error, giving up");
  exit(-1);
}

Assistant:

void
sylvan_serialize_fromfile(FILE *in)
{
    size_t count, i;
    if (fread(&count, sizeof(size_t), 1, in) != 1) {
        // TODO FIXME return error
        printf("sylvan_serialize_fromfile: file format error, giving up\n");
        exit(-1);
    }

    for (i=1; i<=count; i++) {
        struct bddnode node;
        if (fread(&node, sizeof(struct bddnode), 1, in) != 1) {
            // TODO FIXME return error
            printf("sylvan_serialize_fromfile: file format error, giving up\n");
            exit(-1);
        }

        BDD low = sylvan_serialize_get_reversed(bddnode_getlow(&node));
        BDD high = sylvan_serialize_get_reversed(bddnode_gethigh(&node));

        struct sylvan_ser s;
        s.bdd = sylvan_makenode(bddnode_getvariable(&node), low, high);
        s.assigned = ++sylvan_ser_done; // starts at 0 but we want 1-based...

        sylvan_ser_insert(&sylvan_ser_set, &s);
        sylvan_ser_reversed_insert(&sylvan_ser_reversed_set, &s);
    }
}